

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto3_unittest::TestPackedTypes::_InternalSerialize
          (TestPackedTypes *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  long lVar1;
  unsigned_long uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  RepeatedField<int> *pRVar6;
  const_pointer piVar7;
  const_pointer plVar8;
  const_pointer puVar9;
  const_pointer puVar10;
  RepeatedField<unsigned_int> *this_00;
  byte *pbVar11;
  RepeatedField<unsigned_long> *this_01;
  RepeatedField<long> *this_02;
  RepeatedField<float> *this_03;
  const_pointer data;
  RepeatedField<double> *this_04;
  const_pointer data_00;
  RepeatedField<bool> *this_05;
  const_pointer data_01;
  LogMessage *pLVar12;
  UnknownFieldSet *unknown_fields;
  const_pointer piVar13;
  size_t byte_size_6;
  int byte_size_5;
  int byte_size_4;
  int byte_size_3;
  int byte_size_2;
  int byte_size_1;
  int byte_size;
  uint32_t cached_has_bits;
  TestPackedTypes *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestPackedTypes *this_local;
  unsigned_long size;
  unsigned_long element_size;
  unsigned_long size_1;
  unsigned_long element_size_1;
  unsigned_long size_2;
  unsigned_long element_size_2;
  unsigned_long size_3;
  unsigned_long element_size_3;
  unsigned_long size_4;
  unsigned_long element_size_4;
  unsigned_long size_5;
  unsigned_long element_size_5;
  unsigned_long size_6;
  unsigned_long element_size_6;
  const_pointer end_6;
  const_pointer it_6;
  EpsCopyOutputStream *local_800;
  byte *local_7d8;
  ulong local_7d0;
  const_pointer end;
  const_pointer it;
  EpsCopyOutputStream *local_7b0;
  byte *local_788;
  ulong local_780;
  LogMessage local_698;
  Voidify local_681;
  byte *local_680;
  undefined4 local_678;
  undefined4 local_674;
  EpsCopyOutputStream *local_670;
  byte *local_668;
  uint local_660;
  byte local_659;
  LogMessage local_658;
  Voidify local_641;
  byte *local_640;
  uint local_638;
  int local_634;
  EpsCopyOutputStream *local_630;
  byte *local_628;
  uint local_620;
  byte local_619;
  LogMessage local_618;
  Voidify local_601;
  byte *local_600;
  uint local_5f8;
  int local_5f4;
  EpsCopyOutputStream *local_5f0;
  byte *local_5e8;
  uint local_5e0;
  byte local_5d9;
  LogMessage local_5d8;
  Voidify local_5c1;
  byte *local_5c0;
  uint local_5b8;
  int local_5b4;
  EpsCopyOutputStream *local_5b0;
  byte *local_5a8;
  uint local_5a0;
  byte local_599;
  LogMessage local_598;
  Voidify local_581;
  byte *local_580;
  uint local_578;
  int local_574;
  EpsCopyOutputStream *local_570;
  byte *local_568;
  uint local_560;
  byte local_559;
  LogMessage local_558;
  Voidify local_541;
  byte *local_540;
  uint local_538;
  int local_534;
  EpsCopyOutputStream *local_530;
  byte *local_528;
  uint local_520;
  byte local_519;
  LogMessage local_518;
  Voidify local_501;
  byte *local_500;
  uint local_4f8;
  int local_4f4;
  EpsCopyOutputStream *local_4f0;
  byte *local_4e8;
  uint local_4e0;
  byte local_4d9;
  LogMessage local_4d8;
  Voidify local_4c1;
  byte *local_4c0;
  uint local_4b8;
  int local_4b4;
  EpsCopyOutputStream *local_4b0;
  byte *local_4a8;
  uint local_4a0;
  byte local_499;
  LogMessage local_498;
  Voidify local_481;
  byte *local_480;
  uint local_478;
  int local_474;
  EpsCopyOutputStream *local_470;
  byte *local_468;
  uint local_45c;
  byte *local_458;
  uint local_44c;
  byte *local_448;
  uint local_43c;
  byte *local_438;
  uint local_42c;
  byte *local_428;
  uint local_41c;
  byte *local_418;
  uint local_40c;
  byte *local_408;
  uint local_3fc;
  byte *local_3f8;
  uint local_3ec;
  EpsCopyOutputStream *local_3e8;
  uint local_3dc;
  EpsCopyOutputStream *local_3d8;
  uint local_3cc;
  const_pointer local_3c8;
  const_pointer end_1;
  const_pointer it_1;
  EpsCopyOutputStream *local_3b0;
  uint local_3a4;
  RepeatedField<long> *local_3a0;
  int local_394;
  EpsCopyOutputStream *local_390;
  EpsCopyOutputStream *local_388;
  ulong local_380;
  byte *local_378;
  uint local_370;
  int local_36c;
  EpsCopyOutputStream *local_368;
  byte local_359;
  LogMessage local_358;
  Voidify local_341;
  byte *local_340;
  uint local_338;
  int local_334;
  EpsCopyOutputStream *local_330;
  byte *local_328;
  uint local_31c;
  EpsCopyOutputStream *local_318;
  uint local_30c;
  const_pointer local_308;
  const_pointer end_2;
  const_pointer it_2;
  EpsCopyOutputStream *local_2f0;
  uint local_2e4;
  RepeatedField<unsigned_int> *local_2e0;
  int local_2d4;
  EpsCopyOutputStream *local_2d0;
  EpsCopyOutputStream *local_2c8;
  uint local_2bc;
  byte *local_2b8;
  uint local_2b0;
  int local_2ac;
  EpsCopyOutputStream *local_2a8;
  byte local_299;
  LogMessage local_298;
  Voidify local_281;
  byte *local_280;
  uint local_278;
  int local_274;
  EpsCopyOutputStream *local_270;
  byte *local_268;
  uint local_25c;
  EpsCopyOutputStream *local_258;
  uint local_24c;
  const_pointer local_248;
  const_pointer end_3;
  const_pointer it_3;
  EpsCopyOutputStream *local_230;
  uint local_224;
  RepeatedField<unsigned_long> *local_220;
  int local_214;
  EpsCopyOutputStream *local_210;
  EpsCopyOutputStream *local_208;
  ulong local_200;
  byte *local_1f8;
  uint local_1f0;
  int local_1ec;
  EpsCopyOutputStream *local_1e8;
  byte local_1d9;
  LogMessage local_1d8;
  Voidify local_1c1;
  byte *local_1c0;
  uint local_1b8;
  int local_1b4;
  EpsCopyOutputStream *local_1b0;
  byte *local_1a8;
  uint local_19c;
  EpsCopyOutputStream *local_198;
  uint local_18c;
  const_pointer local_188;
  const_pointer end_4;
  const_pointer it_4;
  EpsCopyOutputStream *local_170;
  uint local_164;
  RepeatedField<int> *local_160;
  int local_154;
  EpsCopyOutputStream *local_150;
  EpsCopyOutputStream *local_148;
  uint local_13c;
  byte *local_138;
  uint local_130;
  int local_12c;
  EpsCopyOutputStream *local_128;
  byte local_119;
  LogMessage local_118;
  Voidify local_101;
  byte *local_100;
  uint local_f8;
  int local_f4;
  EpsCopyOutputStream *local_f0;
  byte *local_e8;
  uint local_dc;
  EpsCopyOutputStream *local_d8;
  uint local_cc;
  const_pointer local_c8;
  const_pointer end_5;
  const_pointer it_5;
  EpsCopyOutputStream *local_b0;
  uint local_a4;
  RepeatedField<long> *local_a0;
  int local_94;
  EpsCopyOutputStream *local_90;
  EpsCopyOutputStream *local_88;
  ulong local_80;
  byte *local_78;
  uint local_70;
  int local_6c;
  EpsCopyOutputStream *local_68;
  byte local_59;
  LogMessage local_58;
  Voidify local_41;
  byte *local_40;
  uint local_38;
  int local_34;
  EpsCopyOutputStream *local_30;
  byte *local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  uVar4 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_int32_cached_byte_size_);
  stream_local = (EpsCopyOutputStream *)target;
  if (0 < (int)uVar4) {
    pRVar6 = _internal_packed_int32(this);
    local_480 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    local_474 = 0x5a;
    local_478 = 2;
    local_499 = 0;
    local_470 = stream;
    if (stream->end_ <= local_480) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_498,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_499 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_498);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_481,pLVar12);
    }
    if ((local_499 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_498);
    }
    local_468 = local_480;
    for (local_45c = local_474 << 3 | local_478; 0x7f < local_45c; local_45c = local_45c >> 7) {
      *local_468 = (byte)local_45c | 0x80;
      local_468 = local_468 + 1;
    }
    *local_468 = (byte)local_45c;
    local_3d8 = (EpsCopyOutputStream *)(local_468 + 1);
    for (local_3cc = uVar4; 0x7f < local_3cc; local_3cc = local_3cc >> 7) {
      *(byte *)local_3d8 = (byte)local_3cc | 0x80;
      local_3d8 = (EpsCopyOutputStream *)((long)local_3d8 + 1);
    }
    local_7b0 = (EpsCopyOutputStream *)((long)local_3d8 + 1);
    *(byte *)local_3d8 = (byte)local_3cc;
    local_468 = local_468 + 1;
    local_3d8 = local_7b0;
    piVar7 = google::protobuf::RepeatedField<int>::data(pRVar6);
    iVar5 = google::protobuf::RepeatedField<int>::size(pRVar6);
    end = piVar7;
    do {
      local_788 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_7b0);
      piVar13 = end + 1;
      for (local_780 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end);
          0x7f < local_780; local_780 = local_780 >> 7) {
        *local_788 = (byte)local_780 | 0x80;
        local_788 = local_788 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_788 + 1);
      *local_788 = (byte)local_780;
      end = piVar13;
      local_7b0 = stream_local;
    } while (piVar13 < piVar7 + iVar5);
  }
  uVar4 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_int64_cached_byte_size_);
  if (0 < (int)uVar4) {
    local_3a0 = _internal_packed_int64(this);
    local_394 = 0x5b;
    local_3b0 = stream_local;
    it_1 = (const_pointer)google::protobuf::io::EpsCopyOutputStream::Encode64;
    local_3a4 = uVar4;
    local_390 = stream;
    local_3b0 = (EpsCopyOutputStream *)
                google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_36c = local_394;
    local_370 = local_3a4;
    local_334 = local_394;
    local_338 = 2;
    local_359 = 0;
    local_378 = (byte *)local_3b0;
    local_368 = stream;
    local_340 = (byte *)local_3b0;
    local_330 = stream;
    if (stream->end_ <= local_3b0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_358,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_359 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_358);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_341,pLVar12);
    }
    if ((local_359 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_358);
    }
    local_328 = local_340;
    for (local_31c = local_334 << 3 | local_338; 0x7f < local_31c; local_31c = local_31c >> 7) {
      *local_328 = (byte)local_31c | 0x80;
      local_328 = local_328 + 1;
    }
    local_378 = local_328 + 1;
    *local_328 = (byte)local_31c;
    local_318 = (EpsCopyOutputStream *)local_378;
    for (local_30c = local_370; 0x7f < local_30c; local_30c = local_30c >> 7) {
      *(byte *)local_318 = (byte)local_30c | 0x80;
      local_318 = (EpsCopyOutputStream *)((long)local_318 + 1);
    }
    local_3b0 = (EpsCopyOutputStream *)((long)local_318 + 1);
    *(byte *)local_318 = (byte)local_30c;
    local_328 = local_378;
    local_318 = local_3b0;
    plVar8 = google::protobuf::RepeatedField<long>::data(local_3a0);
    end_1 = plVar8;
    iVar5 = google::protobuf::RepeatedField<long>::size(local_3a0);
    local_3c8 = plVar8 + iVar5;
    do {
      local_3b0 = (EpsCopyOutputStream *)
                  google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_3b0);
      lVar1 = *end_1;
      end_1 = end_1 + 1;
      local_380 = (*(code *)it_1)(lVar1);
      local_388 = local_3b0;
      for (; 0x7f < local_380; local_380 = local_380 >> 7) {
        *(byte *)local_388 = (byte)local_380 | 0x80;
        local_388 = (EpsCopyOutputStream *)((long)local_388 + 1);
      }
      stream_local = (EpsCopyOutputStream *)((long)local_388 + 1);
      *(byte *)local_388 = (byte)local_380;
      local_3b0 = stream_local;
      local_388 = stream_local;
    } while (end_1 < local_3c8);
  }
  uVar4 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_uint32_cached_byte_size_);
  if (0 < (int)uVar4) {
    local_2e0 = _internal_packed_uint32(this);
    local_2d4 = 0x5c;
    local_2f0 = stream_local;
    it_2 = (const_pointer)google::protobuf::io::EpsCopyOutputStream::Encode32;
    local_2e4 = uVar4;
    local_2d0 = stream;
    local_2f0 = (EpsCopyOutputStream *)
                google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_2ac = local_2d4;
    local_2b0 = local_2e4;
    local_274 = local_2d4;
    local_278 = 2;
    local_299 = 0;
    local_2b8 = (byte *)local_2f0;
    local_2a8 = stream;
    local_280 = (byte *)local_2f0;
    local_270 = stream;
    if (stream->end_ <= local_2f0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_298,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_299 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_298);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_281,pLVar12);
    }
    if ((local_299 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_298);
    }
    local_268 = local_280;
    for (local_25c = local_274 << 3 | local_278; 0x7f < local_25c; local_25c = local_25c >> 7) {
      *local_268 = (byte)local_25c | 0x80;
      local_268 = local_268 + 1;
    }
    local_2b8 = local_268 + 1;
    *local_268 = (byte)local_25c;
    local_258 = (EpsCopyOutputStream *)local_2b8;
    for (local_24c = local_2b0; 0x7f < local_24c; local_24c = local_24c >> 7) {
      *(byte *)local_258 = (byte)local_24c | 0x80;
      local_258 = (EpsCopyOutputStream *)((long)local_258 + 1);
    }
    local_2f0 = (EpsCopyOutputStream *)((long)local_258 + 1);
    *(byte *)local_258 = (byte)local_24c;
    local_268 = local_2b8;
    local_258 = local_2f0;
    puVar9 = google::protobuf::RepeatedField<unsigned_int>::data(local_2e0);
    end_2 = puVar9;
    iVar5 = google::protobuf::RepeatedField<unsigned_int>::size(local_2e0);
    local_308 = puVar9 + iVar5;
    do {
      local_2f0 = (EpsCopyOutputStream *)
                  google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_2f0);
      uVar4 = *end_2;
      end_2 = end_2 + 1;
      local_2bc = (*(code *)it_2)(uVar4);
      local_2c8 = local_2f0;
      for (; 0x7f < local_2bc; local_2bc = local_2bc >> 7) {
        *(byte *)local_2c8 = (byte)local_2bc | 0x80;
        local_2c8 = (EpsCopyOutputStream *)((long)local_2c8 + 1);
      }
      stream_local = (EpsCopyOutputStream *)((long)local_2c8 + 1);
      *(byte *)local_2c8 = (byte)local_2bc;
      local_2f0 = stream_local;
      local_2c8 = stream_local;
    } while (end_2 < local_308);
  }
  uVar4 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_uint64_cached_byte_size_);
  if (0 < (int)uVar4) {
    local_220 = _internal_packed_uint64(this);
    local_214 = 0x5d;
    local_230 = stream_local;
    it_3 = (const_pointer)google::protobuf::io::EpsCopyOutputStream::Encode64;
    local_224 = uVar4;
    local_210 = stream;
    local_230 = (EpsCopyOutputStream *)
                google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_1ec = local_214;
    local_1f0 = local_224;
    local_1b4 = local_214;
    local_1b8 = 2;
    local_1d9 = 0;
    local_1f8 = (byte *)local_230;
    local_1e8 = stream;
    local_1c0 = (byte *)local_230;
    local_1b0 = stream;
    if (stream->end_ <= local_230) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_1d9 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1d8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1c1,pLVar12);
    }
    if ((local_1d9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1d8);
    }
    local_1a8 = local_1c0;
    for (local_19c = local_1b4 << 3 | local_1b8; 0x7f < local_19c; local_19c = local_19c >> 7) {
      *local_1a8 = (byte)local_19c | 0x80;
      local_1a8 = local_1a8 + 1;
    }
    local_1f8 = local_1a8 + 1;
    *local_1a8 = (byte)local_19c;
    local_198 = (EpsCopyOutputStream *)local_1f8;
    for (local_18c = local_1f0; 0x7f < local_18c; local_18c = local_18c >> 7) {
      *(byte *)local_198 = (byte)local_18c | 0x80;
      local_198 = (EpsCopyOutputStream *)((long)local_198 + 1);
    }
    local_230 = (EpsCopyOutputStream *)((long)local_198 + 1);
    *(byte *)local_198 = (byte)local_18c;
    local_1a8 = local_1f8;
    local_198 = local_230;
    puVar10 = google::protobuf::RepeatedField<unsigned_long>::data(local_220);
    end_3 = puVar10;
    iVar5 = google::protobuf::RepeatedField<unsigned_long>::size(local_220);
    local_248 = puVar10 + iVar5;
    do {
      local_230 = (EpsCopyOutputStream *)
                  google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_230);
      uVar2 = *end_3;
      end_3 = end_3 + 1;
      local_200 = (*(code *)it_3)(uVar2);
      local_208 = local_230;
      for (; 0x7f < local_200; local_200 = local_200 >> 7) {
        *(byte *)local_208 = (byte)local_200 | 0x80;
        local_208 = (EpsCopyOutputStream *)((long)local_208 + 1);
      }
      stream_local = (EpsCopyOutputStream *)((long)local_208 + 1);
      *(byte *)local_208 = (byte)local_200;
      local_230 = stream_local;
      local_208 = stream_local;
    } while (end_3 < local_248);
  }
  uVar4 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_sint32_cached_byte_size_);
  if (0 < (int)uVar4) {
    local_160 = _internal_packed_sint32(this);
    local_154 = 0x5e;
    local_170 = stream_local;
    it_4 = (const_pointer)google::protobuf::io::EpsCopyOutputStream::ZigZagEncode32;
    local_164 = uVar4;
    local_150 = stream;
    local_170 = (EpsCopyOutputStream *)
                google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_12c = local_154;
    local_130 = local_164;
    local_f4 = local_154;
    local_f8 = 2;
    local_119 = 0;
    local_138 = (byte *)local_170;
    local_128 = stream;
    local_100 = (byte *)local_170;
    local_f0 = stream;
    if (stream->end_ <= local_170) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_118,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_119 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_118);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_101,pLVar12);
    }
    if ((local_119 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_118);
    }
    local_e8 = local_100;
    for (local_dc = local_f4 << 3 | local_f8; 0x7f < local_dc; local_dc = local_dc >> 7) {
      *local_e8 = (byte)local_dc | 0x80;
      local_e8 = local_e8 + 1;
    }
    local_138 = local_e8 + 1;
    *local_e8 = (byte)local_dc;
    local_d8 = (EpsCopyOutputStream *)local_138;
    for (local_cc = local_130; 0x7f < local_cc; local_cc = local_cc >> 7) {
      *(byte *)local_d8 = (byte)local_cc | 0x80;
      local_d8 = (EpsCopyOutputStream *)((long)local_d8 + 1);
    }
    local_170 = (EpsCopyOutputStream *)((long)local_d8 + 1);
    *(byte *)local_d8 = (byte)local_cc;
    local_e8 = local_138;
    local_d8 = local_170;
    piVar7 = google::protobuf::RepeatedField<int>::data(local_160);
    end_4 = piVar7;
    iVar5 = google::protobuf::RepeatedField<int>::size(local_160);
    local_188 = piVar7 + iVar5;
    do {
      local_170 = (EpsCopyOutputStream *)
                  google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_170);
      iVar5 = *end_4;
      end_4 = end_4 + 1;
      local_13c = (*(code *)it_4)(iVar5);
      local_148 = local_170;
      for (; 0x7f < local_13c; local_13c = local_13c >> 7) {
        *(byte *)local_148 = (byte)local_13c | 0x80;
        local_148 = (EpsCopyOutputStream *)((long)local_148 + 1);
      }
      stream_local = (EpsCopyOutputStream *)((long)local_148 + 1);
      *(byte *)local_148 = (byte)local_13c;
      local_170 = stream_local;
      local_148 = stream_local;
    } while (end_4 < local_188);
  }
  uVar4 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_sint64_cached_byte_size_);
  if (0 < (int)uVar4) {
    local_a0 = _internal_packed_sint64(this);
    local_94 = 0x5f;
    local_b0 = stream_local;
    it_5 = (const_pointer)google::protobuf::io::EpsCopyOutputStream::ZigZagEncode64;
    local_a4 = uVar4;
    local_90 = stream;
    local_b0 = (EpsCopyOutputStream *)
               google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                         (stream,(uint8_t *)stream_local);
    local_6c = local_94;
    local_70 = local_a4;
    local_34 = local_94;
    local_38 = 2;
    local_59 = 0;
    local_78 = (byte *)local_b0;
    local_68 = stream;
    local_40 = (byte *)local_b0;
    local_30 = stream;
    if (stream->end_ <= local_b0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_59 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar12);
    }
    if ((local_59 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    local_28 = local_40;
    for (local_1c = local_34 << 3 | local_38; 0x7f < local_1c; local_1c = local_1c >> 7) {
      *local_28 = (byte)local_1c | 0x80;
      local_28 = local_28 + 1;
    }
    local_78 = local_28 + 1;
    *local_28 = (byte)local_1c;
    local_18 = (EpsCopyOutputStream *)local_78;
    for (local_c = local_70; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_b0 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_28 = local_78;
    local_18 = local_b0;
    plVar8 = google::protobuf::RepeatedField<long>::data(local_a0);
    end_5 = plVar8;
    iVar5 = google::protobuf::RepeatedField<long>::size(local_a0);
    local_c8 = plVar8 + iVar5;
    do {
      local_b0 = (EpsCopyOutputStream *)
                 google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_b0);
      lVar1 = *end_5;
      end_5 = end_5 + 1;
      local_80 = (*(code *)it_5)(lVar1);
      local_88 = local_b0;
      for (; 0x7f < local_80; local_80 = local_80 >> 7) {
        *(byte *)local_88 = (byte)local_80 | 0x80;
        local_88 = (EpsCopyOutputStream *)((long)local_88 + 1);
      }
      stream_local = (EpsCopyOutputStream *)((long)local_88 + 1);
      *(byte *)local_88 = (byte)local_80;
      local_b0 = stream_local;
      local_88 = stream_local;
    } while (end_5 < local_c8);
  }
  iVar5 = _internal_packed_fixed32_size(this);
  if (0 < iVar5) {
    this_00 = _internal_packed_fixed32(this);
    pbVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    iVar5 = google::protobuf::RepeatedField<unsigned_int>::size(this_00);
    local_674 = 0x60;
    local_678 = 2;
    local_680 = pbVar11;
    local_670 = stream;
    if (stream->end_ <= pbVar11) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_698,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_698);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_681,pLVar12);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_698);
    }
    local_668 = pbVar11;
    for (local_660 = 0x302; 0x7f < local_660; local_660 = local_660 >> 7) {
      *local_668 = (byte)local_660 | 0x80;
      local_668 = local_668 + 1;
    }
    *local_668 = (byte)local_660;
    local_458 = local_668 + 1;
    for (local_44c = iVar5 << 2; 0x7f < local_44c; local_44c = local_44c >> 7) {
      *local_458 = (byte)local_44c | 0x80;
      local_458 = local_458 + 1;
    }
    pbVar11 = local_458 + 1;
    *local_458 = (byte)local_44c;
    local_668 = local_668 + 1;
    local_458 = pbVar11;
    puVar9 = google::protobuf::RepeatedField<unsigned_int>::data(this_00);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                             (stream,puVar9,iVar5 << 2,pbVar11);
  }
  iVar5 = _internal_packed_fixed64_size(this);
  if (0 < iVar5) {
    this_01 = _internal_packed_fixed64(this);
    pbVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    iVar5 = google::protobuf::RepeatedField<unsigned_long>::size(this_01);
    local_634 = 0x61;
    local_638 = 2;
    local_659 = 0;
    local_640 = pbVar11;
    local_630 = stream;
    if (stream->end_ <= pbVar11) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_658,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_659 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_658);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_641,pLVar12);
    }
    if ((local_659 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_658);
    }
    local_628 = local_640;
    for (local_620 = local_634 << 3 | local_638; 0x7f < local_620; local_620 = local_620 >> 7) {
      *local_628 = (byte)local_620 | 0x80;
      local_628 = local_628 + 1;
    }
    *local_628 = (byte)local_620;
    local_448 = local_628 + 1;
    for (local_43c = iVar5 << 3; 0x7f < local_43c; local_43c = local_43c >> 7) {
      *local_448 = (byte)local_43c | 0x80;
      local_448 = local_448 + 1;
    }
    pbVar11 = local_448 + 1;
    *local_448 = (byte)local_43c;
    local_628 = local_628 + 1;
    local_448 = pbVar11;
    puVar10 = google::protobuf::RepeatedField<unsigned_long>::data(this_01);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                             (stream,puVar10,iVar5 << 3,pbVar11);
  }
  iVar5 = _internal_packed_sfixed32_size(this);
  if (0 < iVar5) {
    pRVar6 = _internal_packed_sfixed32(this);
    pbVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    iVar5 = google::protobuf::RepeatedField<int>::size(pRVar6);
    local_5f4 = 0x62;
    local_5f8 = 2;
    local_619 = 0;
    local_600 = pbVar11;
    local_5f0 = stream;
    if (stream->end_ <= pbVar11) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_618,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_619 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_618);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_601,pLVar12);
    }
    if ((local_619 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_618);
    }
    local_5e8 = local_600;
    for (local_5e0 = local_5f4 << 3 | local_5f8; 0x7f < local_5e0; local_5e0 = local_5e0 >> 7) {
      *local_5e8 = (byte)local_5e0 | 0x80;
      local_5e8 = local_5e8 + 1;
    }
    *local_5e8 = (byte)local_5e0;
    local_438 = local_5e8 + 1;
    for (local_42c = iVar5 << 2; 0x7f < local_42c; local_42c = local_42c >> 7) {
      *local_438 = (byte)local_42c | 0x80;
      local_438 = local_438 + 1;
    }
    pbVar11 = local_438 + 1;
    *local_438 = (byte)local_42c;
    local_5e8 = local_5e8 + 1;
    local_438 = pbVar11;
    piVar7 = google::protobuf::RepeatedField<int>::data(pRVar6);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                             (stream,piVar7,iVar5 << 2,pbVar11);
  }
  iVar5 = _internal_packed_sfixed64_size(this);
  if (0 < iVar5) {
    this_02 = _internal_packed_sfixed64(this);
    pbVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    iVar5 = google::protobuf::RepeatedField<long>::size(this_02);
    local_5b4 = 99;
    local_5b8 = 2;
    local_5d9 = 0;
    local_5c0 = pbVar11;
    local_5b0 = stream;
    if (stream->end_ <= pbVar11) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_5d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_5d9 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_5d8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_5c1,pLVar12);
    }
    if ((local_5d9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_5d8);
    }
    local_5a8 = local_5c0;
    for (local_5a0 = local_5b4 << 3 | local_5b8; 0x7f < local_5a0; local_5a0 = local_5a0 >> 7) {
      *local_5a8 = (byte)local_5a0 | 0x80;
      local_5a8 = local_5a8 + 1;
    }
    *local_5a8 = (byte)local_5a0;
    local_428 = local_5a8 + 1;
    for (local_41c = iVar5 << 3; 0x7f < local_41c; local_41c = local_41c >> 7) {
      *local_428 = (byte)local_41c | 0x80;
      local_428 = local_428 + 1;
    }
    pbVar11 = local_428 + 1;
    *local_428 = (byte)local_41c;
    local_5a8 = local_5a8 + 1;
    local_428 = pbVar11;
    plVar8 = google::protobuf::RepeatedField<long>::data(this_02);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                             (stream,plVar8,iVar5 << 3,pbVar11);
  }
  iVar5 = _internal_packed_float_size(this);
  if (0 < iVar5) {
    this_03 = _internal_packed_float(this);
    pbVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    iVar5 = google::protobuf::RepeatedField<float>::size(this_03);
    local_574 = 100;
    local_578 = 2;
    local_599 = 0;
    local_580 = pbVar11;
    local_570 = stream;
    if (stream->end_ <= pbVar11) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_598,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_599 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_598);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_581,pLVar12);
    }
    if ((local_599 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_598);
    }
    local_568 = local_580;
    for (local_560 = local_574 << 3 | local_578; 0x7f < local_560; local_560 = local_560 >> 7) {
      *local_568 = (byte)local_560 | 0x80;
      local_568 = local_568 + 1;
    }
    *local_568 = (byte)local_560;
    local_418 = local_568 + 1;
    for (local_40c = iVar5 << 2; 0x7f < local_40c; local_40c = local_40c >> 7) {
      *local_418 = (byte)local_40c | 0x80;
      local_418 = local_418 + 1;
    }
    pbVar11 = local_418 + 1;
    *local_418 = (byte)local_40c;
    local_568 = local_568 + 1;
    local_418 = pbVar11;
    data = google::protobuf::RepeatedField<float>::data(this_03);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                             (stream,data,iVar5 << 2,pbVar11);
  }
  iVar5 = _internal_packed_double_size(this);
  if (0 < iVar5) {
    this_04 = _internal_packed_double(this);
    pbVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    iVar5 = google::protobuf::RepeatedField<double>::size(this_04);
    local_534 = 0x65;
    local_538 = 2;
    local_559 = 0;
    local_540 = pbVar11;
    local_530 = stream;
    if (stream->end_ <= pbVar11) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_558,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_559 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_558);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_541,pLVar12);
    }
    if ((local_559 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_558);
    }
    local_528 = local_540;
    for (local_520 = local_534 << 3 | local_538; 0x7f < local_520; local_520 = local_520 >> 7) {
      *local_528 = (byte)local_520 | 0x80;
      local_528 = local_528 + 1;
    }
    *local_528 = (byte)local_520;
    local_408 = local_528 + 1;
    for (local_3fc = iVar5 << 3; 0x7f < local_3fc; local_3fc = local_3fc >> 7) {
      *local_408 = (byte)local_3fc | 0x80;
      local_408 = local_408 + 1;
    }
    pbVar11 = local_408 + 1;
    *local_408 = (byte)local_3fc;
    local_528 = local_528 + 1;
    local_408 = pbVar11;
    data_00 = google::protobuf::RepeatedField<double>::data(this_04);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<8>
                             (stream,data_00,iVar5 << 3,pbVar11);
  }
  iVar5 = _internal_packed_bool_size(this);
  if (0 < iVar5) {
    this_05 = _internal_packed_bool(this);
    pbVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    uVar4 = google::protobuf::RepeatedField<bool>::size(this_05);
    local_4f4 = 0x66;
    local_4f8 = 2;
    local_519 = 0;
    local_500 = pbVar11;
    local_4f0 = stream;
    if (stream->end_ <= pbVar11) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_518,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_519 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_518);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_501,pLVar12);
    }
    if ((local_519 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_518);
    }
    local_4e8 = local_500;
    for (local_4e0 = local_4f4 << 3 | local_4f8; 0x7f < local_4e0; local_4e0 = local_4e0 >> 7) {
      *local_4e8 = (byte)local_4e0 | 0x80;
      local_4e8 = local_4e8 + 1;
    }
    *local_4e8 = (byte)local_4e0;
    local_3f8 = local_4e8 + 1;
    for (local_3ec = uVar4; 0x7f < local_3ec; local_3ec = local_3ec >> 7) {
      *local_3f8 = (byte)local_3ec | 0x80;
      local_3f8 = local_3f8 + 1;
    }
    pbVar11 = local_3f8 + 1;
    *local_3f8 = (byte)local_3ec;
    local_4e8 = local_4e8 + 1;
    local_3f8 = pbVar11;
    data_01 = google::protobuf::RepeatedField<bool>::data(this_05);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<1>
                             (stream,data_01,uVar4,pbVar11);
  }
  uVar4 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_enum_cached_byte_size_);
  if (uVar4 != 0) {
    pRVar6 = _internal_packed_enum(this);
    local_4c0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_4b4 = 0x67;
    local_4b8 = 2;
    local_4d9 = 0;
    local_4b0 = stream;
    if (stream->end_ <= local_4c0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_4d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_4d9 = 1;
      pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_4d8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_4c1,pLVar12);
    }
    if ((local_4d9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_4d8);
    }
    local_4a8 = local_4c0;
    for (local_4a0 = local_4b4 << 3 | local_4b8; 0x7f < local_4a0; local_4a0 = local_4a0 >> 7) {
      *local_4a8 = (byte)local_4a0 | 0x80;
      local_4a8 = local_4a8 + 1;
    }
    *local_4a8 = (byte)local_4a0;
    local_3e8 = (EpsCopyOutputStream *)(local_4a8 + 1);
    for (local_3dc = uVar4; 0x7f < local_3dc; local_3dc = local_3dc >> 7) {
      *(byte *)local_3e8 = (byte)local_3dc | 0x80;
      local_3e8 = (EpsCopyOutputStream *)((long)local_3e8 + 1);
    }
    local_800 = (EpsCopyOutputStream *)((long)local_3e8 + 1);
    *(byte *)local_3e8 = (byte)local_3dc;
    local_4a8 = local_4a8 + 1;
    local_3e8 = local_800;
    piVar7 = google::protobuf::RepeatedField<int>::data(pRVar6);
    iVar5 = google::protobuf::RepeatedField<int>::size(pRVar6);
    end_6 = piVar7;
    do {
      local_7d8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_800);
      piVar13 = end_6 + 1;
      for (local_7d0 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_6);
          0x7f < local_7d0; local_7d0 = local_7d0 >> 7) {
        *local_7d8 = (byte)local_7d0 | 0x80;
        local_7d8 = local_7d8 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_7d8 + 1);
      *local_7d8 = (byte)local_7d0;
      end_6 = piVar13;
      local_800 = stream_local;
    } while (piVar13 < piVar7 + iVar5);
  }
  bVar3 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar3) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestPackedTypes::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestPackedTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto3_unittest.TestPackedTypes)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 packed_int32 = 90 [packed = true];
  {
    int byte_size = this_._impl_._packed_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          90, this_._internal_packed_int32(), byte_size, target);
    }
  }

  // repeated int64 packed_int64 = 91 [packed = true];
  {
    int byte_size = this_._impl_._packed_int64_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt64Packed(
          91, this_._internal_packed_int64(), byte_size, target);
    }
  }

  // repeated uint32 packed_uint32 = 92 [packed = true];
  {
    int byte_size = this_._impl_._packed_uint32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteUInt32Packed(
          92, this_._internal_packed_uint32(), byte_size, target);
    }
  }

  // repeated uint64 packed_uint64 = 93 [packed = true];
  {
    int byte_size = this_._impl_._packed_uint64_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          93, this_._internal_packed_uint64(), byte_size, target);
    }
  }

  // repeated sint32 packed_sint32 = 94 [packed = true];
  {
    int byte_size = this_._impl_._packed_sint32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteSInt32Packed(
          94, this_._internal_packed_sint32(), byte_size, target);
    }
  }

  // repeated sint64 packed_sint64 = 95 [packed = true];
  {
    int byte_size = this_._impl_._packed_sint64_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteSInt64Packed(
          95, this_._internal_packed_sint64(), byte_size, target);
    }
  }

  // repeated fixed32 packed_fixed32 = 96 [packed = true];
  if (this_._internal_packed_fixed32_size() > 0) {
    target = stream->WriteFixedPacked(96, this_._internal_packed_fixed32(), target);
  }

  // repeated fixed64 packed_fixed64 = 97 [packed = true];
  if (this_._internal_packed_fixed64_size() > 0) {
    target = stream->WriteFixedPacked(97, this_._internal_packed_fixed64(), target);
  }

  // repeated sfixed32 packed_sfixed32 = 98 [packed = true];
  if (this_._internal_packed_sfixed32_size() > 0) {
    target = stream->WriteFixedPacked(98, this_._internal_packed_sfixed32(), target);
  }

  // repeated sfixed64 packed_sfixed64 = 99 [packed = true];
  if (this_._internal_packed_sfixed64_size() > 0) {
    target = stream->WriteFixedPacked(99, this_._internal_packed_sfixed64(), target);
  }

  // repeated float packed_float = 100 [packed = true];
  if (this_._internal_packed_float_size() > 0) {
    target = stream->WriteFixedPacked(100, this_._internal_packed_float(), target);
  }

  // repeated double packed_double = 101 [packed = true];
  if (this_._internal_packed_double_size() > 0) {
    target = stream->WriteFixedPacked(101, this_._internal_packed_double(), target);
  }

  // repeated bool packed_bool = 102 [packed = true];
  if (this_._internal_packed_bool_size() > 0) {
    target = stream->WriteFixedPacked(102, this_._internal_packed_bool(), target);
  }

  // repeated .proto3_unittest.ForeignEnum packed_enum = 103 [packed = true];
  {
    ::size_t byte_size = this_._impl_._packed_enum_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          103, this_._internal_packed_enum(), byte_size, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto3_unittest.TestPackedTypes)
  return target;
}